

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t spvtools::val::ValidateExtInstImport(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  long lVar2;
  spv_result_t unaff_EBP;
  string name;
  DiagnosticStream local_200;
  
  if ((_->version_ < 0x10501) &&
     (bVar1 = EnumSet<spvtools::Extension>::contains
                        (&_->module_extensions_,kSPV_KHR_non_semantic_info), !bVar1)) {
    Instruction::GetOperandAs<std::__cxx11::string>(&name,inst,1);
    lVar2 = std::__cxx11::string::find((char *)&name,0x35f0fd);
    if (lVar2 == 0) {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)&local_200,
                      "NonSemantic extended instruction sets cannot be declared without SPV_KHR_non_semantic_info."
                     );
      DiagnosticStream::~DiagnosticStream(&local_200);
      unaff_EBP = local_200.error_;
    }
    std::__cxx11::string::_M_dispose();
    if (lVar2 == 0) {
      return unaff_EBP;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateExtInstImport(ValidationState_t& _,
                                   const Instruction* inst) {
  const auto name_id = 1;
  if (_.version() <= SPV_SPIRV_VERSION_WORD(1, 5) &&
      !_.HasExtension(kSPV_KHR_non_semantic_info)) {
    const std::string name = inst->GetOperandAs<std::string>(name_id);
    if (name.find("NonSemantic.") == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "NonSemantic extended instruction sets cannot be declared "
                "without SPV_KHR_non_semantic_info.";
    }
  }

  return SPV_SUCCESS;
}